

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentEntitySystem.h
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SilentEntitySystem::SilentEntitySystem
          (SilentEntitySystem *this,SilentEntitySystem *param_1)

{
  KUINT16 KVar1;
  SilentEntitySystem *param_1_local;
  SilentEntitySystem *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__SilentEntitySystem_003339c8;
  KVar1 = param_1->m_ui16NumOfAppearanceRecords;
  this->m_ui16NumEnts = param_1->m_ui16NumEnts;
  this->m_ui16NumOfAppearanceRecords = KVar1;
  EntityType::EntityType(&this->m_EntTyp,&param_1->m_EntTyp);
  std::vector<KDIS::DATA_TYPE::EntityAppearance,_std::allocator<KDIS::DATA_TYPE::EntityAppearance>_>
  ::vector(&this->m_vEA,&param_1->m_vEA);
  return;
}

Assistant:

class KDIS_EXPORT SilentEntitySystem : public DataTypeBase
{
protected:

    KUINT16 m_ui16NumEnts;

    KUINT16 m_ui16NumOfAppearanceRecords;

    EntityType m_EntTyp;

    std::vector<EntityAppearance> m_vEA;

public:

    static const KUINT16 SILENT_ENTITY_SYSTEM_SIZE = 12; // Min Size

    SilentEntitySystem();

    SilentEntitySystem(KDataStream &stream) noexcept(false);

    virtual ~SilentEntitySystem();

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentEntitySystem::SetNumberOfEntities
    //              KDIS::DATA_TYPE::SilentEntitySystem::GetNumberOfEntities
    // Description: Number of entities of this type.
    // Parameter:   KUINT16 NOE
    //************************************
    void SetNumberOfEntities( KUINT16 NOE );
    KUINT16 GetNumberOfEntities() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentEntitySystem::GetNumberOfAppearanceRecords
    // Description: Number of appearance records.
    //************************************
    KUINT16 GetNumberOfAppearanceRecords() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentEntitySystem::AddEntityAppearance
    //              KDIS::DATA_TYPE::SilentEntitySystem::SetEntityAppearanceList
    //              KDIS::DATA_TYPE::SilentEntitySystem::GetEntityAppearanceList
    //              KDIS::DATA_TYPE::SilentEntitySystem::ClearEntityAppearanceList
    // Description: The number of Entity Appearance records should be between zero and the number of
    //              entities of this type.
    //              Simulation applications representing the aggregate that do not model
    //              entity appearances shall set this field to zero.
    //              Simulation applications representing the aggregate that model entity
    //              appearances shall set this field to the number of entity appearances
    //              that deviate from the default appearance.
    //              Other simulations can safely assume that any entity appearances not specified are
    //              default appearances.
    //              Exception thrown if the size of the list is greater than the number of entities.
    // Parameter:   const EntityAppearance & EA, const vector<EntityAppearance> & EA
    //************************************
    void AddEntityAppearance(const EntityAppearance &EA) noexcept(false);

    void SetEntityAppearanceList(const std::vector<EntityAppearance> &EA) noexcept(false);
    const std::vector<EntityAppearance> & GetEntityAppearanceList() const;
    void ClearEntityAppearanceList();

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentEntitySystem::SetEntityType
    //              KDIS::DATA_TYPE::SilentEntitySystem::GetEntityType
    // Description: Aggregate type for this record.
    // Parameter:   const EntityType & E
    //************************************
    void SetEntityType( const EntityType & A );
    const EntityType & GetEntityType() const;
    EntityType & GetEntityType();

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentEntitySystem::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentEntitySystem::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::SilentEntitySystem::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const SilentEntitySystem & Value ) const;
    KBOOL operator != ( const SilentEntitySystem & Value ) const;
}